

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O1

bool dg::pta::PointerAnalysisFSInv::invStrongUpdate(PSNode *operand)

{
  long *plVar1;
  PSNode *nd;
  bool bVar2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *pvVar3;
  byte bVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  
  plVar1 = *(long **)(operand + 0xc0);
  if (plVar1 == (long *)0x0) {
    return false;
  }
  lVar5 = 0;
  plVar6 = plVar1;
  do {
    uVar8 = plVar6[2];
    lVar7 = 0;
    if (uVar8 != 0) {
      do {
        lVar7 = lVar7 + (ulong)((uint)uVar8 & 1);
        bVar2 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar2);
    }
    lVar5 = lVar5 + lVar7;
    plVar6 = (long *)*plVar6;
  } while (plVar6 != (long *)0x0);
  if (lVar5 == 1) {
    if ((*(long *)(operand + 200) == 0) || ((plVar1[2] & 1U) != 0)) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      do {
        if (lVar5 == 0x3f) {
          lVar5 = 0x40;
          break;
        }
        bVar4 = (byte)lVar5;
        lVar5 = lVar5 + 1;
      } while (((ulong)plVar1[2] >> (bVar4 & 0x3f) & 2) == 0);
    }
    lVar5 = lVar5 * 0x10 + _LLVMContext;
    if (*(long *)(plVar1[1] * 0x10 + -8 + lVar5) != Offset::UNKNOWN) {
      nd = *(PSNode **)(plVar1[1] * 0x10 + -0x10 + lVar5);
      if (INVALIDATED == nd) {
        return false;
      }
      if (UNKNOWN_MEMORY == nd) {
        return false;
      }
      if (NULLPTR == nd) {
        return false;
      }
      if (*(PointerSubgraph **)(nd + 0xa0) != (PointerSubgraph *)0x0) {
        pvVar3 = PointerSubgraph::getLoop(*(PointerSubgraph **)(nd + 0xa0),nd);
        return pvVar3 == (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

size_t size() const {
        size_t num = 0;
        for (auto &it : _bits)
            num += _countBits(it.second);

        return num;
    }